

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool,false,true>
               (string_t *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  char **ppcVar11;
  ulong uVar12;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar11 = &(ldata->value).pointer.ptr;
    iVar7 = count;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      input_01.value._8_4_ = *rdata;
      input_01.value._0_8_ = *ppcVar11;
      input_01.value._12_4_ = 0;
      iVar3 = GetBitOperator::Operation<duckdb::string_t,int,int>
                        (*(GetBitOperator **)(ppcVar11 + -1),input_01,(int)iVar7);
      result_data[iVar9] = iVar3;
      ppcVar11 = ppcVar11 + 2;
    }
  }
  else {
    uVar10 = 0;
    for (piVar6 = (int *)0x0; piVar6 != (int *)(count + 0x3f >> 6);
        piVar6 = (int *)((long)piVar6 + 1)) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
LAB_01d7512e:
        ppcVar11 = &ldata[uVar10].value.pointer.ptr;
        piVar5 = piVar6;
        for (; uVar4 = uVar10, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          input.value._8_4_ = *rdata;
          input.value._0_8_ = *ppcVar11;
          input.value._12_4_ = 0;
          iVar3 = GetBitOperator::Operation<duckdb::string_t,int,int>
                            (*(GetBitOperator **)(ppcVar11 + -1),input,(int)piVar5);
          result_data[uVar10] = iVar3;
          ppcVar11 = ppcVar11 + 2;
        }
      }
      else {
        uVar2 = puVar1[(long)piVar6];
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01d7512e;
        uVar4 = uVar8;
        if (uVar2 != 0) {
          ppcVar11 = &ldata[uVar10].value.pointer.ptr;
          piVar5 = piVar6;
          for (uVar12 = 0; uVar4 = uVar12 + uVar10, uVar12 + uVar10 < uVar8; uVar12 = uVar12 + 1) {
            if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
              input_00.value._8_4_ = *rdata;
              input_00.value._0_8_ = *ppcVar11;
              input_00.value._12_4_ = 0;
              iVar3 = GetBitOperator::Operation<duckdb::string_t,int,int>
                                (*(GetBitOperator **)(ppcVar11 + -1),input_00,(int)piVar5);
              (result_data + uVar10)[uVar12] = iVar3;
              piVar5 = result_data + uVar10;
            }
            ppcVar11 = ppcVar11 + 2;
          }
        }
      }
      uVar10 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}